

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
 __thiscall anon_unknown.dwarf_2a1200::RawDescriptor::Clone(RawDescriptor *this)

{
  RawDescriptor *this_00;
  pointer __p;
  long in_RSI;
  long in_FS_OFFSET;
  direct_or_indirect local_40;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (RawDescriptor *)operator_new(0x78);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_40.indirect_contents,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(in_RSI + 0x58));
  RawDescriptor(this_00,(CScript *)&local_40.indirect_contents);
  if (0x1c < local_24) {
    free(local_40.indirect_contents.indirect);
  }
  local_40.indirect_contents.indirect = (char *)0x0;
  (this->super_DescriptorImpl).super_Descriptor._vptr_Descriptor = (_func_int **)this_00;
  std::
  unique_ptr<(anonymous_namespace)::RawDescriptor,_std::default_delete<(anonymous_namespace)::RawDescriptor>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::RawDescriptor,_std::default_delete<(anonymous_namespace)::RawDescriptor>_>
                 *)&local_40.indirect_contents);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (__uniq_ptr_data<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>,_true,_true>
            )(__uniq_ptr_data<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<DescriptorImpl> Clone() const override
    {
        return std::make_unique<RawDescriptor>(m_script);
    }